

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

uint __thiscall
QFragmentMapData<QTextFragmentData>::erase_single(QFragmentMapData<QTextFragmentData> *this,uint z)

{
  quint32 *pqVar1;
  int *piVar2;
  undefined4 uVar3;
  QTextFragmentData *pQVar4;
  uint uVar5;
  quint32 qVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  Header *pHVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint p;
  uint x;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  
  uVar13 = (ulong)z;
  uVar5 = previous(this,z);
  pHVar10 = (this->field_0).head;
  lVar17 = uVar13 * 0x20;
  puVar7 = (uint *)((long)pHVar10 + lVar17 + 8);
  uVar12 = (ulong)*(uint *)((long)pHVar10 + lVar17 + 4);
  if (uVar12 == 0) {
LAB_0046464e:
    uVar18 = (ulong)*puVar7;
  }
  else {
    uVar11 = *puVar7;
    if (*puVar7 == 0) {
      puVar7 = (uint *)((long)pHVar10 + lVar17 + 4);
      goto LAB_0046464e;
    }
    do {
      uVar14 = uVar11;
      lVar8 = (ulong)uVar14 * 0x20;
      uVar11 = *(uint *)((long)pHVar10 + lVar8 + 4);
    } while (uVar11 != 0);
    uVar11 = *(uint *)((long)pHVar10 + lVar8 + 8);
    uVar18 = (ulong)uVar11;
    if (uVar14 != z) {
      *(uint *)((long)pHVar10 + uVar12 * 0x20) = uVar14;
      *(undefined4 *)((long)(this->field_0).head + lVar8 + 4) =
           *(undefined4 *)((long)(this->field_0).head + lVar17 + 4);
      *(undefined4 *)((long)(this->field_0).head + lVar8 + 0x10) =
           *(undefined4 *)((long)(this->field_0).head + lVar17 + 0x10);
      pHVar10 = (this->field_0).head;
      if (uVar14 == *(uint *)((long)pHVar10 + uVar13 * 0x20 + 8)) {
        uVar12 = (ulong)uVar14;
      }
      else {
        uVar12 = (ulong)*(uint *)((long)pHVar10 + lVar8);
        if (uVar11 != 0) {
          *(uint *)((long)pHVar10 + uVar18 * 0x20) = *(uint *)((long)pHVar10 + lVar8);
          pHVar10 = (this->field_0).head;
        }
        *(uint *)((long)pHVar10 + uVar12 * 0x20 + 4) = uVar11;
        *(undefined4 *)((long)(this->field_0).head + lVar8 + 8) =
             *(undefined4 *)((long)(this->field_0).head + lVar17 + 8);
        *(uint *)((long)(this->field_0).head +
                 (ulong)*(uint *)((long)(this->field_0).head + lVar17 + 8) * 0x20) = uVar14;
        for (uVar9 = uVar12; pHVar10 = (this->field_0).head, (uint)uVar9 != uVar14;
            uVar9 = (ulong)*(uint *)((long)(this->field_0).head + uVar9 * 0x20)) {
          piVar2 = (int *)((long)pHVar10 + uVar9 * 0x20 + 0x10);
          *piVar2 = *piVar2 - *(int *)((long)pHVar10 + lVar8 + 0x14);
        }
      }
      uVar11 = *(uint *)((long)pHVar10 + lVar17);
      uVar9 = (ulong)uVar11;
      if (uVar9 == 0) {
        pHVar10->root = uVar14;
      }
      else {
        lVar15 = uVar9 * 0x20;
        if (*(uint *)((long)pHVar10 + lVar15 + 4) == z) {
          *(uint *)((long)pHVar10 + lVar15 + 4) = uVar14;
          pqVar1 = (this->field_0).fragments[uVar9].super_QFragment<1>.size_left_array;
          *pqVar1 = *pqVar1 - (this->field_0).fragments[uVar13].super_QFragment<1>.size_array[0];
        }
        else {
          *(uint *)((long)pHVar10 + lVar15 + 8) = uVar14;
        }
      }
      *(uint *)((long)(this->field_0).head + lVar8) = uVar11;
      pHVar10 = (this->field_0).head;
      uVar3 = *(undefined4 *)((long)pHVar10 + lVar8 + 0xc);
      *(undefined4 *)((long)pHVar10 + lVar8 + 0xc) = *(undefined4 *)((long)pHVar10 + lVar17 + 0xc);
      *(undefined4 *)((long)(this->field_0).head + lVar17 + 0xc) = uVar3;
      uVar9 = uVar13;
      goto LAB_00464734;
    }
  }
  uVar11 = *(uint *)((long)pHVar10 + lVar17);
  uVar12 = (ulong)uVar11;
  qVar6 = (quint32)uVar18;
  if (qVar6 != 0) {
    *(uint *)((long)pHVar10 + uVar18 * 0x20) = uVar11;
  }
  pHVar10 = (this->field_0).head;
  if (uVar11 == 0) {
    pHVar10->root = qVar6;
    uVar12 = 0;
    uVar9 = uVar13;
  }
  else {
    lVar8 = uVar12 * 0x20;
    if (*(uint *)((long)pHVar10 + lVar8 + 4) == z) {
      *(quint32 *)((long)pHVar10 + lVar8 + 4) = qVar6;
      pqVar1 = (this->field_0).fragments[uVar12].super_QFragment<1>.size_left_array;
      *pqVar1 = *pqVar1 - (this->field_0).fragments[uVar13].super_QFragment<1>.size_array[0];
      uVar9 = uVar13;
    }
    else {
      *(quint32 *)((long)pHVar10 + lVar8 + 8) = qVar6;
      uVar9 = uVar13;
    }
  }
LAB_00464734:
  while( true ) {
    pQVar4 = (this->field_0).fragments;
    qVar6 = (quint32)uVar9;
    uVar11 = pQVar4[uVar9].super_QFragment<1>.parent;
    uVar9 = (ulong)uVar11;
    if (uVar9 == 0) break;
    if (pQVar4[uVar9].super_QFragment<1>.left == qVar6) {
      pqVar1 = pQVar4[uVar9].super_QFragment<1>.size_left_array;
      *pqVar1 = *pqVar1 - pQVar4[uVar13].super_QFragment<1>.size_array[0];
      uVar9 = (ulong)uVar11;
    }
  }
  freeFragment(this,z);
  pHVar10 = (this->field_0).head;
  if (*(int *)((long)pHVar10 + lVar17 + 0xc) != 0) {
    uVar11 = *(uint *)((long)pHVar10 + uVar18 * 0x20);
    while (uVar13 = uVar12, uVar11 != 0) {
      if ((uVar18 != 0) && (*(int *)((long)pHVar10 + uVar18 * 0x20 + 0xc) != 1)) goto LAB_004649e8;
      lVar17 = uVar13 * 0x20;
      uVar11 = *(uint *)((long)pHVar10 + lVar17 + 4);
      uVar12 = (ulong)uVar11;
      x = (uint)uVar13;
      if ((uint)uVar18 != uVar11) {
        if (*(int *)((long)pHVar10 + uVar12 * 0x20 + 0xc) == 0) {
          *(undefined4 *)((long)pHVar10 + uVar12 * 0x20 + 0xc) = 1;
          *(undefined4 *)((long)(this->field_0).head + lVar17 + 0xc) = 0;
          rotateRight(this,x);
          pHVar10 = (this->field_0).head;
          uVar12 = (ulong)*(uint *)((long)pHVar10 + lVar17 + 4);
        }
        lVar15 = uVar12 * 0x20;
        lVar8 = (long)pHVar10 + lVar15;
        uVar9 = (ulong)*(uint *)((long)pHVar10 + lVar15 + 8);
        if ((uVar9 == 0) || (*(int *)((long)pHVar10 + uVar9 * 0x20 + 0xc) == 1)) {
          uVar16 = (ulong)*(uint *)(lVar8 + 4);
          if ((uVar16 == 0) || (*(int *)((long)pHVar10 + uVar16 * 0x20 + 0xc) == 1))
          goto LAB_004648c0;
LAB_00464965:
          if (*(int *)((long)pHVar10 + uVar16 * 0x20 + 0xc) == 1) {
            if (uVar9 != 0) goto LAB_00464978;
            goto LAB_00464987;
          }
        }
        else {
          uVar16 = (ulong)*(uint *)(lVar8 + 4);
          if (*(uint *)(lVar8 + 4) != 0) goto LAB_00464965;
LAB_00464978:
          *(undefined4 *)((long)pHVar10 + uVar9 * 0x20 + 0xc) = 1;
          pHVar10 = (this->field_0).head;
LAB_00464987:
          *(undefined4 *)((long)pHVar10 + lVar15 + 0xc) = 0;
          rotateLeft(this,*(uint *)((long)(this->field_0).head + lVar17 + 4));
          pHVar10 = (this->field_0).head;
          uVar12 = (ulong)*(uint *)((long)pHVar10 + lVar17 + 4);
        }
        *(undefined4 *)((long)pHVar10 + uVar12 * 0x20 + 0xc) =
             *(undefined4 *)((long)pHVar10 + lVar17 + 0xc);
        *(undefined4 *)((long)(this->field_0).head + lVar17 + 0xc) = 1;
        uVar13 = (ulong)*(uint *)((long)(this->field_0).head + uVar12 * 0x20 + 4);
        if (uVar13 != 0) {
          *(undefined4 *)((long)(this->field_0).head + uVar13 * 0x20 + 0xc) = 1;
        }
        rotateRight(this,x);
        break;
      }
      uVar12 = (ulong)*(uint *)((long)pHVar10 + lVar17 + 8);
      if (*(int *)((long)pHVar10 + uVar12 * 0x20 + 0xc) == 0) {
        *(undefined4 *)((long)pHVar10 + uVar12 * 0x20 + 0xc) = 1;
        *(undefined4 *)((long)(this->field_0).head + lVar17 + 0xc) = 0;
        rotateLeft(this,x);
        pHVar10 = (this->field_0).head;
        uVar12 = (ulong)*(uint *)((long)pHVar10 + lVar17 + 8);
      }
      lVar15 = uVar12 * 0x20;
      lVar8 = (long)pHVar10 + lVar15;
      uVar9 = (ulong)*(uint *)((long)pHVar10 + lVar15 + 4);
      if ((uVar9 != 0) && (*(int *)((long)pHVar10 + uVar9 * 0x20 + 0xc) != 1)) {
        uVar16 = (ulong)*(uint *)(lVar8 + 8);
        if (*(uint *)(lVar8 + 8) != 0) goto LAB_004648dc;
LAB_004648ef:
        *(undefined4 *)((long)pHVar10 + uVar9 * 0x20 + 0xc) = 1;
        pHVar10 = (this->field_0).head;
LAB_004648fe:
        *(undefined4 *)((long)pHVar10 + lVar15 + 0xc) = 0;
        rotateRight(this,*(uint *)((long)(this->field_0).head + lVar17 + 8));
        pHVar10 = (this->field_0).head;
        uVar12 = (ulong)*(uint *)((long)pHVar10 + lVar17 + 8);
LAB_0046491b:
        *(undefined4 *)((long)pHVar10 + uVar12 * 0x20 + 0xc) =
             *(undefined4 *)((long)pHVar10 + lVar17 + 0xc);
        *(undefined4 *)((long)(this->field_0).head + lVar17 + 0xc) = 1;
        uVar13 = (ulong)*(uint *)((long)(this->field_0).head + uVar12 * 0x20 + 8);
        if (uVar13 != 0) {
          *(undefined4 *)((long)(this->field_0).head + uVar13 * 0x20 + 0xc) = 1;
        }
        rotateLeft(this,x);
        break;
      }
      uVar16 = (ulong)*(uint *)(lVar8 + 8);
      if ((uVar16 != 0) && (*(int *)((long)pHVar10 + uVar16 * 0x20 + 0xc) != 1)) {
LAB_004648dc:
        if (*(int *)((long)pHVar10 + uVar16 * 0x20 + 0xc) == 1) {
          if (uVar9 != 0) goto LAB_004648ef;
          goto LAB_004648fe;
        }
        goto LAB_0046491b;
      }
LAB_004648c0:
      *(undefined4 *)(lVar8 + 0xc) = 0;
      pHVar10 = (this->field_0).head;
      uVar11 = *(uint *)((long)pHVar10 + lVar17);
      uVar12 = (ulong)uVar11;
      uVar18 = uVar13;
    }
    if (uVar18 != 0) {
      pHVar10 = (this->field_0).head;
LAB_004649e8:
      *(undefined4 *)((long)pHVar10 + uVar18 * 0x20 + 0xc) = 1;
    }
  }
  return uVar5;
}

Assistant:

uint QFragmentMapData<Fragment>::erase_single(uint z)
{
    uint w = previous(z);
    uint y = z;
    uint x;
    uint p;

    if (!F(y).left) {
        x = F(y).right;
    } else if (!F(y).right) {
        x = F(y).left;
    } else {
        y = F(y).right;
        while (F(y).left)
            y = F(y).left;
        x = F(y).right;
    }

    if (y != z) {
        F(F(z).left).parent = y;
        F(y).left = F(z).left;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_left_array[field];
        if (y != F(z).right) {
            /*
                     z                y
                    / \              / \
                   a   b            a   b
                      /                /
                    ...     -->      ...
                    /                /
                   y                x
                  / \
                 0   x
             */
            p = F(y).parent;
            if (x)
                F(x).parent = p;
            F(p).left = x;
            F(y).right = F(z).right;
            F(F(z).right).parent = y;
            uint n = p;
            while (n != y) {
                for (uint field = 0; field < Fragment::size_array_max; ++field)
                    F(n).size_left_array[field] -= F(y).size_array[field];
                n = F(n).parent;
            }
        } else {
            /*
                     z                y
                    / \              / \
                   a   y     -->    a   x
                      / \
                     0   x
             */
            p = y;
        }
        uint zp = F(z).parent;
        if (!zp) {
            Q_ASSERT(head->root == z);
            head->root = y;
        } else if (F(zp).left == z) {
            F(zp).left = y;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(zp).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(zp).right = y;
        }
        F(y).parent = zp;
        // Swap the colors
        uint c = F(y).color;
        F(y).color = F(z).color;
        F(z).color = c;
        y = z;
    } else {
        /*
                p          p            p          p
               /          /              \          \
              z    -->   x                z  -->     x
              |                           |
              x                           x
         */
        p = F(z).parent;
        if (x)
            F(x).parent = p;
        if (!p) {
            Q_ASSERT(head->root == z);
            head->root = x;
        } else if (F(p).left == z) {
            F(p).left = x;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(p).right = x;
        }
    }
    uint n = z;
    while (F(n).parent) {
        uint p = F(n).parent;
        if (F(p).left == n) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        }
        n = p;
    }

    freeFragment(z);


    if (F(y).color != Red) {
        while (F(x).parent && (x == 0 || F(x).color == Black)) {
            if (x == F(p).left) {
                uint w = F(p).right;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateLeft(p);
                    w = F(p).right;
                }
                if ((F(w).left == 0 || F(F(w).left).color == Black) &&
                    (F(w).right == 0 || F(F(w).right).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).right == 0 || F(F(w).right).color == Black) {
                        if (F(w).left)
                            F(F(w).left).color = Black;
                        F(w).color = Red;
                        rotateRight(F(p).right);
                        w = F(p).right;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).right)
                        F(F(w).right).color = Black;
                    rotateLeft(p);
                    break;
                }
            } else {
                uint w = F(p).left;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateRight(p);
                    w = F(p).left;
                }
                if ((F(w).right == 0 || F(F(w).right).color == Black) &&
                    (F(w).left == 0 || F(F(w).left).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).left == 0 || F(F(w).left).color == Black) {
                        if (F(w).right)
                            F(F(w).right).color = Black;
                        F(w).color = Red;
                        rotateLeft(F(p).left);
                        w = F(p).left;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).left)
                        F(F(w).left).color = Black;
                    rotateRight(p);
                    break;
                }
            }
        }
        if (x)
            F(x).color = Black;
    }

    return w;
}